

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

Literal * __thiscall wasm::Literal::allTrueI64x2(Literal *__return_storage_ptr__,Literal *this)

{
  bool bVar1;
  int32_t iVar2;
  long lVar3;
  Literal local_70;
  undefined1 local_58 [8];
  LaneArray<2> lanes;
  
  getLanesI64x2((LaneArray<2> *)local_58,this);
  lVar3 = 0;
  do {
    makeZero(&local_70,(Type)*(uintptr_t *)((long)&lanes._M_elems[0].field_0 + lVar3 + 8));
    bVar1 = operator==((Literal *)(local_58 + lVar3),&local_70);
    ~Literal(&local_70);
    if (bVar1) {
      iVar2 = 0;
      goto LAB_00c4ba9a;
    }
    lVar3 = lVar3 + 0x18;
  } while (lVar3 == 0x18);
  iVar2 = 1;
LAB_00c4ba9a:
  (__return_storage_ptr__->field_0).i32 = iVar2;
  (__return_storage_ptr__->type).id = 2;
  lVar3 = 0x18;
  do {
    ~Literal((Literal *)(local_58 + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::allTrueI64x2() const {
  return all_true<2, &Literal::getLanesI64x2>(*this);
}